

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

Vector<unsigned_int,_3> __thiscall
gl4cts::Math::greaterThanEqual<3>(Math *this,Vector<double,_3> *left,Vector<double,_3> *right)

{
  Vector<unsigned_int,_3> VVar1;
  tcu local_13 [3];
  
  tcu::greaterThanEqual<double,3>(local_13,left,right);
  VVar1 = convertBvecToUvec<3>(this,(Vector<bool,_3> *)local_13);
  VVar1.m_data._0_8_ = this;
  return (Vector<unsigned_int,_3>)VVar1.m_data;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> greaterThanEqual(const tcu::Vector<glw::GLdouble, Size>& left,
													   const tcu::Vector<glw::GLdouble, Size>& right)
{
	return convertBvecToUvec(tcu::greaterThanEqual(left, right));
}